

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O3

void delay_timer_cb(uv_timer_t *timer)

{
  int *piVar1;
  int iVar2;
  long extraout_RAX;
  long lVar3;
  uint uVar4;
  uv_timer_t *puVar5;
  undefined8 *__ptr;
  
  puVar5 = (uv_timer_t *)timer->data;
  iVar2 = uv_is_active();
  if (iVar2 == 0) {
    uVar4 = *(uint *)((long)&puVar5[2].u + 8);
    if (uVar4 == 0) goto LAB_00167fe7;
    uVar4 = uVar4 | *(uint *)((long)&puVar5[2].u + 4);
    *(uint *)((long)&puVar5[2].u + 4) = uVar4;
    *(undefined4 *)((long)&puVar5[2].u + 8) = 0;
    iVar2 = uv_poll_start(puVar5,uVar4,connection_poll_cb);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    delay_timer_cb_cold_1();
LAB_00167fe7:
    puVar5 = timer;
    delay_timer_cb_cold_3();
  }
  delay_timer_cb_cold_2();
  __ptr = (undefined8 *)puVar5->data;
  piVar1 = (int *)((long)__ptr + 0x154);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  if (test_mode == '\x01') {
    lVar3 = __ptr[0x28];
    if (*(int *)(__ptr + 0x2a) != 0) {
      if (lVar3 == 0x10000) {
        if (__ptr[0x29] == 0) goto LAB_00168053;
        connection_close_cb_cold_2();
        goto LAB_0016802f;
      }
      goto LAB_0016803c;
    }
LAB_00168041:
    if (lVar3 != 0) goto LAB_00168064;
  }
  else {
LAB_0016802f:
    if (__ptr[0x28] != 0x10000) {
LAB_0016803c:
      connection_close_cb_cold_1();
      lVar3 = extraout_RAX;
      goto LAB_00168041;
    }
  }
  if (__ptr[0x29] == 0x10000) {
LAB_00168053:
    closed_connections = closed_connections + 1;
    free(__ptr);
    return;
  }
  connection_close_cb_cold_4();
LAB_00168064:
  connection_close_cb_cold_3();
  free((void *)*__ptr);
  return;
}

Assistant:

static void delay_timer_cb(uv_timer_t* timer) {
  connection_context_t* context = (connection_context_t*) timer->data;
  int r;

  /* Timer should auto stop. */
  ASSERT(0 == uv_is_active((uv_handle_t*) timer));

  /* Add the requested events to the poll mask. */
  ASSERT(context->delayed_events != 0);
  context->events |= context->delayed_events;
  context->delayed_events = 0;

  r = uv_poll_start(&context->poll_handle,
                    context->events,
                    connection_poll_cb);
  ASSERT(r == 0);
}